

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::RaiiWrapper::~RaiiWrapper(RaiiWrapper *this)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    (**(code **)(*(long *)*in_RDI + 0x10))();
    if ((long *)*in_RDI != (long *)0x0) {
      (**(code **)(*(long *)*in_RDI + 8))();
    }
    *in_RDI = 0;
  }
  return;
}

Assistant:

BamToolsIndex::RaiiWrapper::~RaiiWrapper()
{
    if (Device) {
        Device->Close();
        delete Device;
        Device = 0;
    }
}